

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void evthread_notify_drain_eventfd(int fd,short what,void *arg)

{
  ssize_t sVar1;
  int *piVar2;
  uint64_t msg;
  undefined1 auStack_18 [8];
  
  sVar1 = read(fd,auStack_18,8);
  if (sVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0xb) {
      event_sock_warn(fd,"Error reading from eventfd");
    }
  }
  if (*(void **)((long)arg + 0x1b0) != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,*(void **)((long)arg + 0x1b0));
  }
  *(undefined4 *)((long)arg + 0x1f0) = 0;
  if (*(void **)((long)arg + 0x1b0) != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,*(void **)((long)arg + 0x1b0));
    return;
  }
  return;
}

Assistant:

static void
evthread_notify_drain_eventfd(evutil_socket_t fd, short what, void *arg)
{
	ev_uint64_t msg;
	ev_ssize_t r;
	struct event_base *base = arg;

	r = read(fd, (void*) &msg, sizeof(msg));
	if (r<0 && errno != EAGAIN) {
		event_sock_warn(fd, "Error reading from eventfd");
	}
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	base->is_notify_pending = 0;
	EVBASE_RELEASE_LOCK(base, th_base_lock);
}